

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::PythonGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,Type *type)

{
  BaseType BVar1;
  char *__s;
  undefined1 local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_UNION) {
    __s = "self._tab.Union(";
  }
  else {
    if (BVar1 == BASE_TYPE_VECTOR) {
      local_80._0_4_ = type->element;
      local_80._24_2_ = type->fixed_length;
      local_80._4_4_ = BASE_TYPE_NONE;
      local_80._8_8_ = type->struct_def;
      local_80._16_8_ = type->enum_def;
      GenGetter_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_80);
      return __return_storage_ptr__;
    }
    if (BVar1 != BASE_TYPE_STRING) {
      GenTypeGet_abi_cxx11_(&local_40,this,type);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_60,&this->namer_,&local_40,(ulong)(this->namer_).super_Namer.config_.methods
                );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "self._tab.Get(flatbuffers.number_types.",&local_60);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "Flags, ");
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    __s = "self._tab.String(";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "self._tab.String(";
      case BASE_TYPE_UNION: return "self._tab.Union(";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default:
        return "self._tab.Get(flatbuffers.number_types." +
               namer_.Method(GenTypeGet(type)) + "Flags, ";
    }
  }